

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O1

void Ntk_SymFunGenerate(int nVars,int fVerbose)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *pComp;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *p_00;
  ulong uVar9;
  word *pwVar10;
  size_t sVar11;
  uint *puVar12;
  word **ppwVar13;
  word *pwVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  word wVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  char Ones [100];
  byte local_98 [104];
  
  pComp = Extra_GreyCodeSchedule(nVars);
  bVar3 = (byte)nVars;
  bVar15 = bVar3 - 6;
  iVar2 = 1 << (bVar15 & 0x1f);
  if (nVars < 7) {
    iVar2 = 1;
  }
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar2;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar23 = 9999;
  while( true ) {
    do {
      uVar5 = uVar23;
      uVar23 = uVar5 + 1;
    } while ((uVar5 & 1) != 0);
    if (uVar23 < 9) break;
    iVar16 = 5;
    while (uVar23 % (iVar16 - 2U) != 0) {
      uVar4 = iVar16 * iVar16;
      iVar16 = iVar16 + 2;
      if (uVar23 < uVar4) goto LAB_00319f4e;
    }
  }
LAB_00319f4e:
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar5) {
    uVar4 = uVar23;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar4;
  piVar8 = (int *)malloc((long)(int)uVar4 << 2);
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar23;
  if (piVar8 != (int *)0x0) {
    memset(piVar8,0xff,(long)(int)uVar23 << 2);
  }
  p->vTable = pVVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 10000;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(40000);
  p_00->pArray = piVar8;
  p->vNexts = p_00;
  if (nVars - 0x11U < 0xfffffff0) {
    __assert_fail("!(nVars < 1 || nVars > 16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSymm.c"
                  ,0x13a,"void Ntk_SymFunGenerate(int, int)");
  }
  printf("Generating truth tables of all symmetric functions of %d variables.\n",(ulong)(uint)nVars)
  ;
  iVar16 = 2;
  if (nVars != 1) {
    iVar16 = nVars;
  }
  iVar17 = 3;
  if (iVar16 != 2) {
    iVar17 = iVar16;
  }
  if (nVars < 7) {
    bVar15 = 0;
  }
  uVar23 = 0;
  do {
    local_98[0x50] = 0;
    local_98[0x51] = 0;
    local_98[0x52] = 0;
    local_98[0x53] = 0;
    local_98[0x54] = 0;
    local_98[0x55] = 0;
    local_98[0x56] = 0;
    local_98[0x57] = 0;
    local_98[0x58] = 0;
    local_98[0x59] = 0;
    local_98[0x5a] = 0;
    local_98[0x5b] = 0;
    local_98[0x5c] = 0;
    local_98[0x5d] = 0;
    local_98[0x5e] = 0;
    local_98[0x5f] = 0;
    local_98[0x40] = 0;
    local_98[0x41] = 0;
    local_98[0x42] = 0;
    local_98[0x43] = 0;
    local_98[0x44] = 0;
    local_98[0x45] = 0;
    local_98[0x46] = 0;
    local_98[0x47] = 0;
    local_98[0x48] = 0;
    local_98[0x49] = 0;
    local_98[0x4a] = 0;
    local_98[0x4b] = 0;
    local_98[0x4c] = 0;
    local_98[0x4d] = 0;
    local_98[0x4e] = 0;
    local_98[0x4f] = 0;
    local_98[0x30] = 0;
    local_98[0x31] = 0;
    local_98[0x32] = 0;
    local_98[0x33] = 0;
    local_98[0x34] = 0;
    local_98[0x35] = 0;
    local_98[0x36] = 0;
    local_98[0x37] = 0;
    local_98[0x38] = 0;
    local_98[0x39] = 0;
    local_98[0x3a] = 0;
    local_98[0x3b] = 0;
    local_98[0x3c] = 0;
    local_98[0x3d] = 0;
    local_98[0x3e] = 0;
    local_98[0x3f] = 0;
    local_98[0x20] = 0;
    local_98[0x21] = 0;
    local_98[0x22] = 0;
    local_98[0x23] = 0;
    local_98[0x24] = 0;
    local_98[0x25] = 0;
    local_98[0x26] = 0;
    local_98[0x27] = 0;
    local_98[0x28] = 0;
    local_98[0x29] = 0;
    local_98[0x2a] = 0;
    local_98[0x2b] = 0;
    local_98[0x2c] = 0;
    local_98[0x2d] = 0;
    local_98[0x2e] = 0;
    local_98[0x2f] = 0;
    local_98[0x10] = 0;
    local_98[0x11] = 0;
    local_98[0x12] = 0;
    local_98[0x13] = 0;
    local_98[0x14] = 0;
    local_98[0x15] = 0;
    local_98[0x16] = 0;
    local_98[0x17] = 0;
    local_98[0x18] = 0;
    local_98[0x19] = 0;
    local_98[0x1a] = 0;
    local_98[0x1b] = 0;
    local_98[0x1c] = 0;
    local_98[0x1d] = 0;
    local_98[0x1e] = 0;
    local_98[0x1f] = 0;
    local_98[0] = 0;
    local_98[1] = 0;
    local_98[2] = 0;
    local_98[3] = 0;
    local_98[4] = 0;
    local_98[5] = 0;
    local_98[6] = 0;
    local_98[7] = 0;
    local_98[8] = 0;
    local_98[9] = 0;
    local_98[10] = 0;
    local_98[0xb] = 0;
    local_98[0xc] = 0;
    local_98[0xd] = 0;
    local_98[0xe] = 0;
    local_98[0xf] = 0;
    local_98[0x60] = 0;
    local_98[0x61] = 0;
    local_98[0x62] = 0;
    local_98[99] = 0;
    uVar9 = 0;
    do {
      local_98[uVar9] = (uVar23 >> ((uint)uVar9 & 0x1f) & 1) != 0 | 0x30;
      uVar9 = uVar9 + 1;
    } while (nVars + 1U != uVar9);
    if (fVerbose != 0) {
      printf("%s : ",local_98);
    }
    pwVar10 = (word *)calloc((long)iVar2,8);
    sVar11 = strlen((char *)local_98);
    if (nVars + 1U != (uint)sVar11) {
      __assert_fail("(int)strlen(pOnes) == nVars + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0xdad,"word *Abc_TtSymFunGenerate(char *, int)");
    }
    uVar5 = 0;
    do {
      if (nVars < 1) {
        uVar9 = 0;
      }
      else {
        uVar4 = 0;
        uVar21 = 0;
        do {
          uVar4 = uVar4 + ((uVar5 >> (uVar21 & 0x1f) & 1) != 0);
          uVar21 = uVar21 + 1;
        } while (nVars != uVar21);
        uVar9 = (ulong)uVar4;
      }
      if (local_98[uVar9] == 0x31) {
        pwVar10[uVar5 >> 6] = pwVar10[uVar5 >> 6] ^ 1L << ((byte)uVar5 & 0x3f);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 >> (bVar3 & 0x1f) == 0);
    if (nVars < 6) {
      wVar19 = (ulong)((uint)*pwVar10 & 3) * 5;
      if (nVars != 1) {
        wVar19 = *pwVar10;
      }
      uVar5 = (uint)wVar19 & 0xf;
      uVar9 = (ulong)(uVar5 << 4 | uVar5);
      if (iVar16 != 2) {
        uVar9 = wVar19;
      }
      uVar20 = (ulong)(uint)((int)(uVar9 & 0xff) << 8) | uVar9 & 0xff;
      if (iVar17 != 3) {
        uVar20 = uVar9;
      }
      uVar9 = (ulong)((uint)uVar20 << 0x10 | (uint)uVar20 & 0xffff);
      if (1 < iVar17 - 3U) {
        uVar9 = uVar20;
      }
      *pwVar10 = uVar9 << 0x20 | uVar9 & 0xffffffff;
    }
    if (fVerbose != 0) {
      Extra_PrintHex(_stdout,(uint *)pwVar10,nVars);
    }
    Ntk_SymFunDeriveNpn(pwVar10,nVars,pComp);
    uVar5 = p->nEntries;
    if (pVVar7->nSize < (int)uVar5) {
      uVar9 = (ulong)(pVVar7->nSize * 2 - 1);
      while( true ) {
        do {
          uVar4 = (uint)uVar9;
          uVar21 = uVar4 + 1;
          uVar24 = (ulong)uVar21;
          uVar20 = uVar9 & 1;
          uVar9 = uVar24;
        } while (uVar20 != 0);
        if (uVar21 < 9) break;
        iVar18 = 5;
        while (uVar21 % (iVar18 - 2U) != 0) {
          uVar6 = iVar18 * iVar18;
          iVar18 = iVar18 + 2;
          if (uVar21 < uVar6) goto LAB_0031a23c;
        }
      }
LAB_0031a23c:
      if (pVVar7->nCap < (int)uVar21) {
        if (pVVar7->pArray == (int *)0x0) {
          piVar8 = (int *)malloc((long)(int)uVar21 << 2);
        }
        else {
          piVar8 = (int *)realloc(pVVar7->pArray,(long)(int)uVar21 << 2);
        }
        pVVar7->pArray = piVar8;
        if (piVar8 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar7->nCap = uVar21;
      }
      if (uVar4 < 0x7fffffff) {
        memset(pVVar7->pArray,0xff,uVar24 << 2);
      }
      pVVar7->nSize = uVar21;
      p_00->nSize = 0;
      if (0 < (int)uVar5) {
        ppwVar13 = p->ppPages;
        pwVar14 = *ppwVar13;
        if (pwVar14 != (word *)0x0) {
          uVar4 = 1;
          do {
            pwVar14 = pwVar14 + (int)((uVar4 - 1 & 0xfff) << (bVar15 & 0x1f));
            piVar8 = Vec_MemHashLookup(p,pwVar14);
            if (*piVar8 != -1) {
              __assert_fail("*pSpot == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                            ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
            }
            *piVar8 = p_00->nSize;
            Vec_IntPush(p_00,(int)pwVar14);
            if (uVar5 == uVar4) break;
            pwVar14 = ppwVar13[uVar4 >> 0xc];
            uVar4 = uVar4 + 1;
          } while (pwVar14 != (word *)0x0);
        }
      }
      if (uVar5 != p_00->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
      }
    }
    pwVar14 = pwVar10;
    puVar12 = (uint *)Vec_MemHashLookup(p,pwVar10);
    uVar4 = *puVar12;
    if (uVar4 == 0xffffffff) {
      *puVar12 = p_00->nSize;
      Vec_IntPush(p_00,(int)pwVar14);
      if ((int)uVar5 < 0) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
      }
      uVar4 = uVar5 >> 0xc;
      iVar18 = p->iPage;
      if (iVar18 < (int)uVar4) {
        iVar1 = p->nPageAlloc;
        if (iVar1 <= (int)uVar4) {
          iVar22 = uVar4 + 0x20;
          if (iVar1 != 0) {
            iVar22 = iVar1 * 2;
          }
          p->nPageAlloc = iVar22;
          if (p->ppPages == (word **)0x0) {
            ppwVar13 = (word **)malloc((long)iVar22 * 8);
          }
          else {
            ppwVar13 = (word **)realloc(p->ppPages,(long)iVar22 * 8);
          }
          p->ppPages = ppwVar13;
        }
        ppwVar13 = p->ppPages;
        uVar9 = (long)iVar18;
        do {
          uVar20 = uVar9 + 1;
          pwVar14 = (word *)malloc((long)(iVar2 << 0xc) << 3);
          ppwVar13[uVar9 + 1] = pwVar14;
          uVar9 = uVar20;
        } while (uVar4 != uVar20);
        p->iPage = uVar4;
      }
      p->nEntries = uVar5 + 1;
      memmove(p->ppPages[uVar4] + (int)((uVar5 & 0xfff) << (bVar15 & 0x1f)),pwVar10,(long)iVar2 * 8)
      ;
      if (uVar5 + 1 != p_00->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
      }
      uVar4 = p_00->nSize - 1;
    }
    if (fVerbose != 0) {
      printf(" : NPN ");
      Extra_PrintHex(_stdout,(uint *)pwVar10,nVars);
      printf("  Class %3d",(ulong)uVar4);
      putchar(10);
    }
    if (pwVar10 != (word *)0x0) {
      free(pwVar10);
    }
    uVar23 = uVar23 + 1;
    if (uVar23 == 2 << (bVar3 & 0x1f)) {
      printf("The number of different NPN classes is %d.\n",(ulong)(uint)p->nEntries);
      if (pVVar7->pArray != (int *)0x0) {
        free(pVVar7->pArray);
        pVVar7->pArray = (int *)0x0;
      }
      free(pVVar7);
      p->vTable = (Vec_Int_t *)0x0;
      pVVar7 = p->vNexts;
      if (pVVar7 != (Vec_Int_t *)0x0) {
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
          pVVar7->pArray = (int *)0x0;
        }
        free(pVVar7);
        p->vNexts = (Vec_Int_t *)0x0;
      }
      uVar23 = p->iPage;
      if (-1 < (int)uVar23) {
        ppwVar13 = p->ppPages;
        lVar25 = 0;
        do {
          pwVar10 = ppwVar13[lVar25];
          if (pwVar10 != (word *)0x0) {
            free(pwVar10);
            ppwVar13[lVar25] = (word *)0x0;
          }
          lVar25 = lVar25 + 1;
        } while ((ulong)uVar23 + 1 != lVar25);
      }
      if (p->ppPages != (word **)0x0) {
        free(p->ppPages);
        p->ppPages = (word **)0x0;
      }
      free(p);
      if (pComp != (int *)0x0) {
        free(pComp);
      }
      return;
    }
  } while( true );
}

Assistant:

void Ntk_SymFunGenerate( int nVars, int fVerbose )
{
    int k, m, Class;
    int * pComp = Extra_GreyCodeSchedule( nVars );
    Vec_Mem_t * vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 );
    Vec_MemHashAlloc( vTtMem, 10000 );
    assert( !(nVars < 1 || nVars > 16) );
    printf( "Generating truth tables of all symmetric functions of %d variables.\n", nVars );
    for ( m = 0; m < (1 << (nVars+1)); m++ )
    {
        word * pFun;
        char Ones[100] = {0};
        for ( k = 0; k <= nVars; k++ )
            Ones[k] = '0' + ((m >> k) & 1);
        if ( fVerbose )
            printf( "%s : ", Ones );
        pFun = Abc_TtSymFunGenerate( Ones, nVars );
        if ( nVars < 6 )
            pFun[0] = Abc_Tt6Stretch( pFun[0], nVars );
        if ( fVerbose )
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
        Ntk_SymFunDeriveNpn( pFun, nVars, pComp );
        Class = Vec_MemHashInsert( vTtMem, pFun );
        if ( fVerbose )
        {
            printf( " : NPN " );
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
            printf( "  Class %3d", Class );
            printf( "\n" );
        }
        ABC_FREE( pFun );
    }
    printf( "The number of different NPN classes is %d.\n", Vec_MemEntryNum(vTtMem) );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    ABC_FREE( pComp );
}